

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTexCube
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  long *plVar1;
  TestLog *log;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int height;
  ulong uVar11;
  CubeFace face;
  ContextWrapper *this_00;
  Surface result;
  Surface reference;
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  long *local_240;
  undefined8 local_238;
  long local_230;
  undefined8 uStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  ulong local_200;
  ContextWrapper *local_1f8;
  TextureSpecCase *local_1f0;
  ReferenceContext *local_1e8;
  GLContext *local_1e0;
  Surface local_1d8;
  Surface local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  int iVar10;
  
  uVar9 = 1;
  if ((this->m_flags & 1) != 0) {
    uVar9 = this->m_width;
    uVar3 = 0x20;
    uVar7 = 0x20;
    if (uVar9 != 0) {
      uVar7 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar9 = this->m_height;
    if (uVar9 != 0) {
      uVar3 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar10 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar7)) {
      iVar10 = 0x1f - uVar7;
    }
    uVar9 = iVar10 + 1;
    if (uVar9 == 0) {
      return;
    }
  }
  this_00 = &this->super_ContextWrapper;
  local_200 = 0;
  local_1f8 = this_00;
  local_1f0 = this;
  local_1e8 = refContext;
  local_1e0 = gles2Context;
  do {
    iVar4 = this->m_width >> ((byte)local_200 & 0x1f);
    iVar10 = 1;
    if (1 < iVar4) {
      iVar10 = iVar4;
    }
    iVar8 = this->m_height >> ((byte)local_200 & 0x1f);
    height = 1;
    if (1 < iVar8) {
      height = iVar8;
    }
    iVar6 = (int)local_200;
    face = CUBEFACE_NEGATIVE_X;
    do {
      tcu::Surface::Surface(&local_1c0);
      tcu::Surface::Surface(&local_1d8);
      if (2 < iVar8 && 2 < iVar4) {
        sglr::ContextWrapper::setContext(this_00,&local_1e0->super_Context);
        renderTexCube(this,&local_1d8,iVar10,height,face);
        sglr::ContextWrapper::setContext(this_00,&local_1e8->super_Context);
        renderTexCube(this,&local_1c0,iVar10,height,face);
        log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        local_260 = local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,"Image comparison result: ","");
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        tcu::operator<<((ostream *)local_1a8,face);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_260 != local_250) {
          uVar11 = local_250[0];
        }
        if (uVar11 < (ulong)(local_218 + local_258)) {
          uVar11 = 0xf;
          if (local_220 != local_210) {
            uVar11 = local_210[0];
          }
          if (uVar11 < (ulong)(local_218 + local_258)) goto LAB_00346e66;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_260);
        }
        else {
LAB_00346e66:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_220);
        }
        plVar1 = puVar5 + 2;
        if ((long *)*puVar5 == plVar1) {
          local_230 = *plVar1;
          uStack_228 = puVar5[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *plVar1;
          local_240 = (long *)*puVar5;
        }
        local_238 = puVar5[1];
        *puVar5 = plVar1;
        puVar5[1] = 0;
        *(undefined1 *)plVar1 = 0;
        bVar2 = tcu::fuzzyCompare(log,"Result",(char *)local_240,&local_1c0,&local_1d8,0.02,
                                  COMPARE_LOG_ON_ERROR - (iVar6 == 0));
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        if (local_220 != local_210) {
          operator_delete(local_220,local_210[0] + 1);
        }
        if (local_260 != local_250) {
          operator_delete(local_260,local_250[0] + 1);
        }
        this = local_1f0;
        this_00 = local_1f8;
        if (!bVar2) {
          tcu::TestContext::setTestResult
                    ((local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image comparison failed");
          tcu::Surface::~Surface(&local_1d8);
          tcu::Surface::~Surface(&local_1c0);
          return;
        }
      }
      tcu::Surface::~Surface(&local_1d8);
      tcu::Surface::~Surface(&local_1c0);
      face = face + CUBEFACE_POSITIVE_X;
    } while (face != CUBEFACE_LAST);
    uVar7 = (int)local_200 + 1;
    local_200 = (ulong)uVar7;
    if (uVar7 == uVar9) {
      return;
    }
  } while( true );
}

Assistant:

void TextureSpecCase::verifyTexCube (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_CUBE);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int		levelW	= de::max(1, m_width >> levelNdx);
		int		levelH	= de::max(1, m_height >> levelNdx);
		bool	isOk	= true;

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			if (levelW <= 2 || levelH <= 2)
				continue; // Don't bother checking.

			// Render with GLES2
			setContext(&gles2Context);
			renderTexCube(result, levelW, levelH, (tcu::CubeFace)face);

			// Render reference.
			setContext(&refContext);
			renderTexCube(reference, levelW, levelH, (tcu::CubeFace)face);

			const float	threshold	= 0.02f;
			isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Result", (string("Image comparison result: ") + de::toString((tcu::CubeFace)face)).c_str(), reference, result, threshold,
									 levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}

		if (!isOk)
			break;
	}
}